

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::Pattern::eval
          (ConstantValue *__return_storage_ptr__,Pattern *this,EvalContext *context,
          ConstantValue *value,CaseStatementCondition conditionKind)

{
  ConstantValue *pCVar1;
  
  pCVar1 = (ConstantValue *)
           (*(code *)(&DAT_0054fc4c + *(int *)(&DAT_0054fc4c + (ulong)this->kind * 4)))();
  return pCVar1;
}

Assistant:

ConstantValue Pattern::eval(EvalContext& context, const ConstantValue& value,
                            CaseStatementCondition conditionKind) const {
    EvalVisitor visitor;
    return visit(visitor, context, value, conditionKind);
}